

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O0

int si9ma::DP::save_money_dp(int *arr,int length,int index,int target)

{
  void *__s;
  void *pvVar1;
  size_t sVar2;
  undefined4 *__s_00;
  undefined8 uStack_90;
  int aiStack_88 [4];
  int local_78;
  int local_70;
  ulong local_68;
  void *local_60;
  undefined4 *local_58;
  int local_4c;
  int local_48;
  int j;
  int i;
  bool is_first_main;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_24;
  int local_20;
  int target_local;
  int index_local;
  int length_local;
  int *arr_local;
  
  __vla_expr0 = (unsigned_long)aiStack_88;
  if (((arr == (int *)0x0) || (index < 0)) || (length <= index)) {
    arr_local._4_4_ = 0;
  }
  else {
    __vla_expr1 = (unsigned_long)(target + 1);
    __s_00 = (undefined4 *)((long)aiStack_88 - (__vla_expr1 * 4 + 0xf & 0xfffffffffffffff0));
    local_68 = (ulong)(target + 1);
    pvVar1 = (void *)((long)__s_00 - (local_68 * 4 + 0xf & 0xfffffffffffffff0));
    sVar2 = __vla_expr1 << 2;
    local_60 = pvVar1;
    local_58 = __s_00;
    _i = local_68;
    local_24 = target;
    local_20 = index;
    target_local = length;
    _index_local = arr;
    *(undefined8 *)((long)pvVar1 + -8) = 0x11def5;
    memset(__s_00,0,sVar2);
    __s = local_60;
    sVar2 = local_68 << 2;
    *(undefined8 *)((long)pvVar1 + -8) = 0x11df08;
    memset(__s,0,sVar2);
    j._3_1_ = 0;
    *local_58 = 1;
    while (local_48 = target_local + -1, -1 < local_48) {
      for (local_4c = 0; local_4c <= local_24; local_4c = local_4c + 1) {
        if ((j._3_1_ & 1) == 0) {
          if (local_4c - _index_local[local_48] < 0) {
            local_78 = 0;
          }
          else {
            local_78 = *(int *)((long)local_60 + (long)(local_4c - _index_local[local_48]) * 4);
          }
          *(int *)((long)local_60 + (long)local_4c * 4) = local_58[local_4c] + local_78;
        }
        else {
          if (local_4c - _index_local[local_48] < 0) {
            local_70 = 0;
          }
          else {
            local_70 = local_58[local_4c - _index_local[local_48]];
          }
          local_58[local_4c] = *(int *)((long)local_60 + (long)local_4c * 4) + local_70;
        }
      }
      j._3_1_ = (j._3_1_ ^ 0xff) & 1;
      target_local = local_48;
    }
    if ((j._3_1_ & 1) == 0) {
      aiStack_88[3] = local_58[local_24];
    }
    else {
      aiStack_88[3] = *(int *)((long)local_60 + (long)local_24 * 4);
    }
    arr_local._4_4_ = aiStack_88[3];
  }
  return arr_local._4_4_;
}

Assistant:

int DP::save_money_dp(int *arr, int length, int index, int target) {
        if (arr == nullptr || index < 0 || index >= length)
            return 0;

        int res_arr1[target + 1];
        int res_arr2[target + 1];
        memset(res_arr1,0, sizeof(res_arr1));
        memset(res_arr2,0, sizeof(res_arr2));
        bool is_first_main = false;
        res_arr1[0] = 1;

        for (int i = length - 1 ; i >= 0 ; --i) {
            for (int j = 0; j <= target; ++j) {
                if (is_first_main)
                    res_arr1[j] = res_arr2[j] + (j - arr[i] < 0 ? 0 : res_arr1[j - arr[i]]);
                else
                    res_arr2[j] = res_arr1[j] + (j - arr[i] < 0 ? 0:  res_arr2[j - arr[i]]);
            }

            is_first_main = !is_first_main;
        }

        return is_first_main ? res_arr2[target] : res_arr1[target];
    }